

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> * __thiscall
QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>::operator=
          (QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *this,
          QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *other)

{
  Data *pDVar1;
  int *piVar2;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *this_00;
  Data *o;
  
  pDVar1 = other->d;
  if (*(Data **)this != pDVar1) {
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    piVar2 = *(int **)this;
    if ((piVar2 != (int *)0x0) && (*piVar2 != -1)) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         (this_00 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                      **)this,
         this_00 !=
         (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *)
         0x0)) {
        QHashPrivate::
        Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>::~Data
                  (this_00);
        operator_delete(this_00,0x28);
      }
    }
    *(Data **)this = pDVar1;
  }
  return (QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)this;
}

Assistant:

QHash &operator=(const QHash &other) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (d != other.d) {
            Data *o = other.d;
            if (o)
                o->ref.ref();
            if (d && !d->ref.deref())
                delete d;
            d = o;
        }
        return *this;
    }